

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O3

RealType __thiscall
OpenMD::SC::getSuggestedCutoffRadius(SC *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  RealType RVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar2 = AtomType::getIdent(atypes.first);
  iVar3 = AtomType::getIdent(atypes.second);
  piVar1 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)piVar1[iVar2];
  iVar2 = piVar1[iVar3];
  RVar5 = 0.0;
  if (iVar2 != -1 && lVar4 != -1) {
    RVar5 = *(RealType *)
             (*(long *)&(this->MixingMap).
                        super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar4].
                        super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                        ._M_impl.super__Vector_impl_data + 0x20 + (long)iVar2 * 0x48);
  }
  return RVar5;
}

Assistant:

RealType SC::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int& sctid1 = SCtids[atid1];
    int& sctid2 = SCtids[atid2];

    if (sctid1 == -1 || sctid2 == -1) {
      return 0.0;
    } else {
      return MixingMap[sctid1][sctid2].rCut;
    }
  }